

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliReader.cpp
# Opt level: O2

void __thiscall cali::CaliReader::CaliReader(CaliReader *this)

{
  _Head_base<0UL,_cali::CaliReader::CaliReaderImpl_*,_false> _Var1;
  
  _Var1._M_head_impl = (CaliReaderImpl *)operator_new(0x30);
  (_Var1._M_head_impl)->m_error = false;
  ((_Var1._M_head_impl)->m_error_msg)._M_dataplus =
       (pointer)((long)&(_Var1._M_head_impl)->m_error_msg + 0x10);
  *(size_type *)((long)&(_Var1._M_head_impl)->m_error_msg + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var1._M_head_impl)->m_error_msg + 0x10))->_M_local_buf[0] = '\0';
  (this->mP)._M_t.
  super___uniq_ptr_impl<cali::CaliReader::CaliReaderImpl,_std::default_delete<cali::CaliReader::CaliReaderImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_cali::CaliReader::CaliReaderImpl_*,_std::default_delete<cali::CaliReader::CaliReaderImpl>_>
  .super__Head_base<0UL,_cali::CaliReader::CaliReaderImpl_*,_false>._M_head_impl =
       _Var1._M_head_impl;
  return;
}

Assistant:

CaliReader::CaliReader() : mP { new CaliReaderImpl() }
{}